

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_filesystem.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  char cVar1;
  int iVar2;
  path *ppVar3;
  ostream *poVar4;
  directory_iterator it;
  directory_iterator end;
  char local_79;
  long *local_78 [2];
  long local_68 [3];
  path local_50;
  undefined7 uStack_4f;
  long local_40 [3];
  
  if (argc == 4) {
    iVar2 = strcmp(argv[1],"rm");
    if ((iVar2 == 0) && (iVar2 = strcmp(argv[2],"-r"), iVar2 == 0)) {
      Omega_h::filesystem::path::path((path *)local_78,argv[3]);
      Omega_h::filesystem::remove_all((path *)local_78);
LAB_00101497:
      if (local_78[0] == local_68) {
        return 0;
      }
      operator_delete(local_78[0],local_68[0] + 1);
      return 0;
    }
  }
  else if (argc == 3) {
    iVar2 = strcmp(argv[1],"rm");
    if (iVar2 == 0) {
      Omega_h::filesystem::path::path((path *)local_78,argv[2]);
      Omega_h::filesystem::remove((path *)local_78);
      goto LAB_00101497;
    }
  }
  else if (argc == 2) {
    __s1 = argv[1];
    iVar2 = strcmp(__s1,"pwd");
    if (iVar2 == 0) {
      Omega_h::filesystem::current_path();
      poVar4 = (ostream *)Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_78);
      local_50 = (path)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_50,1);
      goto LAB_00101497;
    }
    iVar2 = strcmp(__s1,"ls");
    if (iVar2 == 0) {
      Omega_h::filesystem::current_path();
      Omega_h::filesystem::directory_iterator::directory_iterator
                ((directory_iterator *)local_78,&local_50);
      if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
        operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
      }
      Omega_h::filesystem::directory_iterator::directory_iterator((directory_iterator *)&local_50);
      while (cVar1 = Omega_h::filesystem::directory_iterator::operator==
                               ((directory_iterator *)local_78,(directory_iterator *)&local_50),
            cVar1 == '\0') {
        ppVar3 = (path *)Omega_h::filesystem::directory_iterator::operator->
                                   ((directory_iterator *)local_78);
        poVar4 = (ostream *)Omega_h::filesystem::operator<<((ostream *)&std::cout,ppVar3);
        local_79 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_79,1);
        Omega_h::filesystem::directory_iterator::operator++((directory_iterator *)local_78);
      }
      Omega_h::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&local_50);
      Omega_h::filesystem::directory_iterator::~directory_iterator((directory_iterator *)local_78);
      return 0;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"usage: osh_filesystem pwd\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"       osh_filesystem ls\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"       osh_filesystem rm <file>\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"       osh_filesystem rm -r <dir>\n",0x22);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  if (argc == 2 && 0 == strcmp(argv[1], "pwd")) {
    std::cout << Omega_h::filesystem::current_path() << '\n';
  } else if (argc == 2 && 0 == strcmp(argv[1], "ls")) {
    for (Omega_h::filesystem::directory_iterator
             it(Omega_h::filesystem::current_path()),
         end;
         it != end; ++it) {
      std::cout << it->path() << '\n';
    }
  } else if (argc == 3 && 0 == strcmp(argv[1], "rm")) {
    Omega_h::filesystem::remove(argv[2]);
  } else if (argc == 4 && 0 == strcmp(argv[1], "rm") &&
             0 == strcmp(argv[2], "-r")) {
    Omega_h::filesystem::remove_all(argv[3]);
  } else {
    std::cout << "usage: osh_filesystem pwd\n";
    std::cout << "       osh_filesystem ls\n";
    std::cout << "       osh_filesystem rm <file>\n";
    std::cout << "       osh_filesystem rm -r <dir>\n";
  }
}